

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator-global.c
# Opt level: O2

int main(void)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  char option;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  puts("Hello! Welcome to the CWorkshop Calculator!\n");
  do {
    printf("Valor: %f\n",value);
    puts(
        "\'+\' - Sum; \'-\' - Subtract; \'*\' - Multiply; \'/\' - Divide; \'c\' - Clear; \'e\' - Exit\n"
        );
    printf("OPTION: ");
    __isoc99_scanf(" %c",(long)&uStack_38 + 7);
    if (uStack_38._7_1_ - 0x2a < 6) {
      iVar2 = (*(code *)(&DAT_00102004 +
                        *(int *)(&DAT_00102004 + (ulong)(uStack_38._7_1_ - 0x2a) * 4)))();
      return iVar2;
    }
    bVar1 = uStack_38._7_1_;
    if (uStack_38._7_1_ == 99) {
      value = 0.0;
      bVar1 = 99;
    }
  } while (bVar1 != 0x65);
  return 0;
}

Assistant:

int main() {
    char option = 0;

    printf("Hello! Welcome to the CWorkshop Calculator!\n\n");
    do {
    
        printf("Valor: %f\n", value);
       
        printf("'+' - Sum; '-' - Subtract; '*' - Multiply; '/' - Divide; 'c' - Clear; 'e' - Exit\n\n");
        
        printf("OPTION: ");
        scanf(" %c", &option);
        
        switch (option) {
            case '+':
                Sum();
                break;
            case '-':
                Subtract();
                break;
            case '*':
                Multiply();
                break;
            case '/':
                Divide();
                break;
            case 'c':
                Clear();
                break;
            case 'e':
                break;
            default:
                break;
        }
    
    } while(option != 'e');
    
    return 0;
}